

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_device.c
# Opt level: O2

MPP_RET mpp_dev_init(MppDev *ctx,MppClientType type)

{
  RK_U32 RVar1;
  MppIoctlVersion MVar2;
  MPP_RET MVar3;
  MppClientType *ptr;
  void *ptr_00;
  MppDevApi *pMVar4;
  
  if (ctx == (MppDev *)0x0) {
    _mpp_log_l(2,"mpp_device","found NULL input ctx\n","mpp_dev_init");
    MVar3 = MPP_ERR_NULL_PTR;
  }
  else {
    mpp_env_get_u32("mpp_device_debug",&mpp_device_debug,0);
    *ctx = (MppDev)0x0;
    RVar1 = mpp_get_vcodec_type();
    if ((RVar1 >> (type & (VPU_CLIENT_BUTT|VPU_CLIENT_VDPU2)) & 1) == 0) {
      _mpp_log_l(2,"mpp_device","found unsupported client type %d in platform %x\n","mpp_dev_init",
                 (ulong)type,(ulong)RVar1);
      MVar3 = MPP_ERR_VALUE;
    }
    else {
      MVar2 = mpp_get_ioctl_version();
      if (MVar2 == IOCTL_VCODEC_SERVICE) {
        pMVar4 = &vcodec_service_api;
      }
      else {
        if (MVar2 != IOCTL_MPP_SERVICE_V1) {
          _mpp_log_l(2,"mpp_device","invalid ioctl verstion %d\n","mpp_dev_init",(ulong)MVar2);
          return MPP_NOK;
        }
        pMVar4 = &mpp_service_api;
      }
      ptr = (MppClientType *)mpp_osal_calloc("mpp_dev_init",0x18);
      ptr_00 = mpp_osal_calloc("mpp_dev_init",(ulong)pMVar4->ctx_size);
      if ((ptr != (MppClientType *)0x0) && (ptr_00 != (void *)0x0)) {
        *(void **)(ptr + 2) = ptr_00;
        *(MppDevApi **)(ptr + 4) = pMVar4;
        *ptr = type;
        *ctx = ptr;
        MVar3 = (*pMVar4->init)(ptr_00,type);
        return MVar3;
      }
      _mpp_log_l(2,"mpp_device","malloc failed impl %p impl_ctx %p\n","mpp_dev_init",ptr,ptr_00);
      if (ptr != (MppClientType *)0x0) {
        mpp_osal_free("mpp_dev_init",ptr);
      }
      MVar3 = MPP_ERR_MALLOC;
      if (ptr_00 != (void *)0x0) {
        mpp_osal_free("mpp_dev_init",ptr_00);
      }
    }
  }
  return MVar3;
}

Assistant:

MPP_RET mpp_dev_init(MppDev *ctx, MppClientType type)
{
    if (NULL == ctx) {
        mpp_err_f("found NULL input ctx\n");
        return MPP_ERR_NULL_PTR;
    }

    mpp_env_get_u32("mpp_device_debug", &mpp_device_debug, 0);

    *ctx = NULL;

    RK_U32 codec_type = mpp_get_vcodec_type();
    if (!(codec_type & (1 << type))) {
        mpp_err_f("found unsupported client type %d in platform %x\n",
                  type, codec_type);
        return MPP_ERR_VALUE;
    }

    MppIoctlVersion ioctl_version = mpp_get_ioctl_version();
    const MppDevApi *api = NULL;

    switch (ioctl_version) {
    case IOCTL_VCODEC_SERVICE : {
        api = &vcodec_service_api;
    } break;
    case IOCTL_MPP_SERVICE_V1 : {
        api = &mpp_service_api;
    } break;
    default : {
        mpp_err_f("invalid ioctl verstion %d\n", ioctl_version);
        return MPP_NOK;
    } break;
    }

    MppDevImpl *impl = mpp_calloc(MppDevImpl, 1);
    void *impl_ctx = mpp_calloc_size(void, api->ctx_size);
    if (NULL == impl || NULL == impl_ctx) {
        mpp_err_f("malloc failed impl %p impl_ctx %p\n", impl, impl_ctx);
        MPP_FREE(impl);
        MPP_FREE(impl_ctx);
        return MPP_ERR_MALLOC;
    }

    impl->ctx = impl_ctx;
    impl->api = api;
    impl->type = type;
    *ctx = impl;

    return api->init(impl_ctx, type);
}